

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  _Rb_tree_header *p_Var1;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_00;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar2;
  iterator iVar3;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *pSVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  int iVar7;
  int iVar8;
  pointer pvVar9;
  uint *puVar10;
  _Hash_node_base *p_Var11;
  pointer pvVar12;
  uint uVar13;
  Simplex_key idx_fil;
  Simplex_key key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertices;
  pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
  cocycle;
  uint local_8c;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_88;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_80;
  uint *local_78;
  iterator iStack_70;
  uint *local_68;
  int local_5c;
  undefined1 local_58 [32];
  Simplex_handle local_38;
  
  if (0 < this->dim_max_) {
    (this->interval_length_policy).min_length_ = min_interval_length;
    local_8c = 0xffffffff;
    local_78 = (uint *)0x0;
    iStack_70._M_current = (uint *)0x0;
    local_68 = (uint *)0x0;
    this_00 = this->cpx_;
    pvVar9 = (this_00->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (this_00->filtration_vect_).
              super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar10 = local_78;
    iVar3._M_current = iStack_70._M_current;
    if (pvVar9 == pvVar12) {
      local_58._0_8_ = this_00;
      Simplex_tree<Gudhi::Simplex_tree_options_default>::
      initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>)_2_>
                (this_00,(is_before_in_totally_ordered_filtration *)local_58,
                 (anon_class_1_0_00000001 *)&local_88);
      pvVar9 = (this_00->filtration_vect_).
               super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar12 = (this_00->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar10 = local_78;
      iVar3._M_current = iStack_70._M_current;
    }
    for (; local_78 = puVar10, iStack_70._M_current = iVar3._M_current, pvVar9 != pvVar12;
        pvVar9 = pvVar9 + 1) {
      ppVar2 = pvVar9->m_ptr;
      uVar13 = local_8c + 1;
      local_8c = uVar13;
      local_88.m_ptr = ppVar2;
      Simplex_tree<Gudhi::Simplex_tree_options_default>::_to_node_it
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_58,
                 (Simplex_handle *)this->cpx_);
      *(uint *)&((__node_base *)
                &((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                   *)(local_58._0_8_ + 8))->super_Key_simplex_base)->_M_nxt = uVar13;
      uVar13 = (ppVar2->second).super_Key_simplex_base.key_;
      (this->dsets_).parent[uVar13] = uVar13;
      (this->dsets_).rank[uVar13] = 0;
      pSVar4 = (ppVar2->second).children_;
      if ((pSVar4->parent_ == ppVar2->first) &&
         (pSVar4 = pSVar4->oncles_, pSVar4 == (Siblings *)0x0)) {
        iVar8 = -1;
LAB_0010ad67:
        local_58._24_8_ = ppVar2;
        update_cohomology_groups(this,(Simplex_handle *)(local_58 + 0x18),iVar8);
      }
      else {
        iVar7 = -2;
        do {
          iVar8 = iVar7;
          pSVar4 = pSVar4->oncles_;
          iVar7 = iVar8 + 1;
        } while (pSVar4 != (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                            *)0x0);
        if (iVar7 == -1) {
          if (iStack_70._M_current == local_68) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,iStack_70,
                       &local_8c);
          }
          else {
            *iStack_70._M_current = local_8c;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        else {
          if (iVar7 != 0) {
            iVar8 = iVar8 + 2;
            goto LAB_0010ad67;
          }
          local_38.m_ptr = ppVar2;
          update_cohomology_groups_edge(this,&local_38);
        }
      }
      puVar10 = local_78;
      iVar3._M_current = iStack_70._M_current;
    }
    if (puVar10 != iVar3._M_current) {
      do {
        uVar13 = *puVar10;
        local_80.m_ptr._0_4_ = uVar13;
        if (((this->ds_parent_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13] == uVar13) &&
           (iVar5 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&(this->zero_cocycles_)._M_h,(key_type_conflict1 *)&local_80),
           iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
           _M_cur == (__node_type *)0x0)) {
          local_58._0_8_ =
               (this->cpx_->filtration_vect_).
               super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(ulong)local_80.m_ptr & 0xffffffff].m_ptr;
          local_88.m_ptr =
               (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                *)0x0;
          local_5c = (this->coeff_field_).Prime;
          std::
          vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
          ::
          emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>
                    ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
                      *)&this->persistent_pairs_,
                     (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                      *)local_58,&local_88,&local_5c);
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != iVar3._M_current);
    }
    p_Var11 = (this->zero_cocycles_)._M_h._M_before_begin._M_nxt;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ =
             (this->cpx_->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(uint *)((long)&p_Var11[1]._M_nxt + 4)].
             m_ptr;
        local_88.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)0x0;
        local_80.m_ptr._0_4_ = (this->coeff_field_).Prime;
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
                    *)&this->persistent_pairs_,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)local_58,&local_88,(int *)&local_80);
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
    p_Var6 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        local_58._16_8_ = p_Var6[1]._M_left;
        local_58._0_8_ = *(undefined8 *)(p_Var6 + 1);
        local_58._8_8_ = p_Var6[1]._M_parent;
        local_88.m_ptr =
             (this->cpx_->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_58._0_8_ & 0xffffffff].m_ptr;
        local_80.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)0x0;
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int&>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>
                    *)&this->persistent_pairs_,&local_88,&local_80,(int *)(local_58 + 0x10));
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    if (local_78 != (uint *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }